

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m256v_copy_submat(m256v *A,int A_row_offs,int A_col_offs,int n_row,int n_col,m256v *At,
                      int At_row_offs,int At_col_offs)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if (0 < n_row) {
    lVar3 = (long)At_row_offs;
    lVar2 = (long)A_row_offs;
    uVar1 = 0;
    do {
      lVar4 = (long)At_col_offs;
      uVar5 = (ulong)(uint)n_col;
      lVar6 = (long)A_col_offs;
      if (0 < n_col) {
        do {
          At->e[lVar4 + At->rstride * lVar3] = A->e[lVar6 + A->rstride * lVar2];
          lVar4 = lVar4 + 1;
          lVar6 = lVar6 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      uVar1 = uVar1 + 1;
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 1;
    } while (uVar1 != (uint)n_row);
  }
  return;
}

Assistant:

void MV_GEN_N(_copy_submat)(const MV_GEN_TYPE* A,
				int A_row_offs,
				int A_col_offs,
				int n_row,
				int n_col,
				MV_GEN_TYPE* At,
				int At_row_offs,
				int At_col_offs)
{
	assert(0 <= n_row);
	assert(0 <= n_col);

	assert(0 <= A_row_offs);
	assert(0 <= A_col_offs);
	assert(A_row_offs + n_row <= A->n_row);
	assert(A_col_offs + n_col <= A->n_col);

	assert(0 <= At_row_offs);
	assert(0 <= At_col_offs);
	assert(At_row_offs + n_row <= At->n_row);
	assert(At_col_offs + n_col <= At->n_col);

	for (int r = 0; r < n_row; ++r) {
		for (int c = 0; c < n_col; ++c) {
			MV_GEN_N(_set_el)(At,
			  r + At_row_offs,
			  c + At_col_offs,
			  MV_GEN_N(_get_el)(A, r + A_row_offs, c + A_col_offs));
		}
	}
}